

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  PGroup *pPVar1;
  PCache1 *pPVar2;
  PgHdr1 *pPVar3;
  int iVar4;
  u64 uVar5;
  void *pvVar6;
  ulong uVar7;
  PgHdr1 **ppPVar8;
  long lVar9;
  uint uVar10;
  PgHdr1 **ppPVar11;
  int iVar12;
  PgHdr1 *pPVar13;
  u64 n;
  
  pPVar1 = pCache->pGroup;
  if (createFlag == 1) {
    uVar10 = pCache->nPage - pCache->nRecyclable;
    if ((pPVar1->mxPinned <= uVar10) || (pCache->n90pct <= uVar10)) {
      return (PgHdr1 *)0x0;
    }
    if ((pcache1_g.nSlot == 0) ||
       (iVar12 = pcache1_g.bUnderPressure, pcache1_g.szSlot < pCache->szExtra + pCache->szPage)) {
      iVar12 = mem0.nearlyFull;
    }
    if (iVar12 != 0 && pCache->nRecyclable < uVar10) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= pCache->nPage) {
    pcache1ResizeHash(pCache);
  }
  iVar12 = pCache->bPurgeable;
  if ((iVar12 == 0) || (pPVar13 = (pPVar1->lru).pLruPrev, pPVar13->isAnchor != 0)) {
LAB_001c0548:
    pPVar13 = (PgHdr1 *)0x0;
  }
  else {
    if (pCache->nPage + 1 < pCache->nMax) {
      iVar4 = mem0.nearlyFull;
      if ((pcache1_g.nSlot != 0) && (pCache->szExtra + pCache->szPage <= pcache1_g.szSlot)) {
        iVar4 = pcache1_g.bUnderPressure;
      }
      if (iVar4 == 0) goto LAB_001c0548;
    }
    pPVar2 = pPVar13->pCache;
    ppPVar8 = pPVar2->apHash + (ulong)pPVar13->iKey % (ulong)pPVar2->nHash;
    do {
      ppPVar11 = ppPVar8;
      pPVar3 = *ppPVar11;
      ppPVar8 = &pPVar3->pNext;
    } while (pPVar3 != pPVar13);
    *ppPVar11 = *ppPVar8;
    pPVar2->nPage = pPVar2->nPage - 1;
    pPVar3 = pPVar13->pLruPrev;
    pPVar3->pLruNext = pPVar13->pLruNext;
    pPVar13->pLruNext->pLruPrev = pPVar3;
    pPVar13->pLruNext = (PgHdr1 *)0x0;
    pPVar2 = pPVar13->pCache;
    pPVar2->nRecyclable = pPVar2->nRecyclable - 1;
    if (pPVar2->szAlloc != pCache->szAlloc) {
      pcache1FreePage(pPVar13);
      goto LAB_001c0548;
    }
    pPVar1->nPurgeable = pPVar1->nPurgeable + (iVar12 - pPVar2->bPurgeable);
  }
  if (pPVar13 != (PgHdr1 *)0x0) goto LAB_001c0773;
  if (pCache->pFree == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      lVar9 = (long)pcache1_g.nInitPage;
      if (lVar9 < 1) {
        uVar5 = lVar9 * -0x400;
      }
      else {
        uVar5 = pCache->szAlloc * lVar9;
      }
      n = (ulong)pCache->nMax * (long)pCache->szAlloc;
      if ((long)uVar5 < (long)n) {
        n = uVar5;
      }
      pvVar6 = sqlite3Malloc(n);
      pCache->pBulk = pvVar6;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar6 != (void *)0x0) {
        iVar4 = (*sqlite3Config.m.xSize)(pvVar6);
        iVar12 = pCache->szAlloc;
        uVar7 = (long)iVar4 / (long)iVar12 & 0xffffffff;
        lVar9 = (long)pCache->szPage;
        pPVar13 = pCache->pFree;
        do {
          *(void **)((long)pvVar6 + lVar9) = pvVar6;
          *(long *)((long)pvVar6 + lVar9 + 8) = (long)pvVar6 + lVar9 + 0x38;
          *(undefined4 *)((long)pvVar6 + lVar9 + 0x14) = 1;
          *(PgHdr1 **)((long)pvVar6 + lVar9 + 0x18) = pPVar13;
          pPVar13 = (PgHdr1 *)((long)pvVar6 + lVar9);
          *(undefined8 *)((long)pvVar6 + lVar9 + 0x30) = 0;
          pvVar6 = (void *)((long)pvVar6 + (long)iVar12);
          uVar10 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar10;
        } while (uVar10 != 0);
        pCache->pFree = (PgHdr1 *)((long)pvVar6 + (lVar9 - iVar12));
      }
      if (pCache->pFree != (PgHdr1 *)0x0) goto LAB_001c055a;
    }
    if ((createFlag == 1) && (sqlite3Hooks_0 != (code *)0x0)) {
      (*sqlite3Hooks_0)();
    }
    pvVar6 = pcache1Alloc(pCache->szAlloc);
    if ((createFlag == 1) && (sqlite3Hooks_1 != (code *)0x0)) {
      (*sqlite3Hooks_1)();
    }
    if (pvVar6 == (void *)0x0) {
      pPVar13 = (PgHdr1 *)0x0;
      goto LAB_001c0773;
    }
    lVar9 = (long)pCache->szPage;
    pPVar13 = (PgHdr1 *)((long)pvVar6 + lVar9);
    *(void **)((long)pvVar6 + lVar9) = pvVar6;
    *(long *)((long)pvVar6 + lVar9 + 8) = (long)pvVar6 + lVar9 + 0x38;
    *(undefined4 *)((long)pvVar6 + lVar9 + 0x14) = 0;
    ppPVar8 = (PgHdr1 **)((long)pvVar6 + lVar9 + 0x30);
  }
  else {
LAB_001c055a:
    pPVar13 = pCache->pFree;
    ppPVar8 = &pPVar13->pNext;
    pCache->pFree = pPVar13->pNext;
  }
  *ppPVar8 = (PgHdr1 *)0x0;
  *pCache->pnPurgeable = *pCache->pnPurgeable + 1;
LAB_001c0773:
  if (pPVar13 != (PgHdr1 *)0x0) {
    uVar7 = (ulong)iKey % (ulong)pCache->nHash;
    pCache->nPage = pCache->nPage + 1;
    pPVar13->iKey = iKey;
    pPVar13->pNext = pCache->apHash[uVar7];
    pPVar13->pCache = pCache;
    pPVar13->pLruNext = (PgHdr1 *)0x0;
    *(undefined8 *)(pPVar13->page).pExtra = 0;
    pCache->apHash[uVar7] = pPVar13;
    if (pCache->iMaxKey < iKey) {
      pCache->iMaxKey = iKey;
    }
  }
  return pPVar13;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache,
  unsigned int iKey,
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found,
  ** attempt to allocate a new one.
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}